

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inst_debug_printf_pass.cpp
# Opt level: O0

void __thiscall
spvtools::opt::InstDebugPrintfPass::GenOutputCode
          (InstDebugPrintfPass *this,Instruction *printf_inst,
          vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
          *new_blocks)

{
  Analysis preserved_analyses;
  uint32_t shader_id;
  uint32_t instruction_idx_id;
  reference this_00;
  type parent_block;
  IRContext *pIVar1;
  mapped_type *pmVar2;
  uint32_t local_ac;
  anon_class_32_4_db63d4fb local_a8;
  function<void_(unsigned_int_*)> local_88;
  bool local_61;
  undefined1 local_60 [7];
  bool is_first_operand;
  vector<unsigned_int,_std::allocator<unsigned_int>_> val_ids;
  InstructionBuilder builder;
  BasicBlock *back_blk_ptr;
  vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
  *new_blocks_local;
  Instruction *printf_inst_local;
  InstDebugPrintfPass *this_local;
  
  this_00 = std::
            vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
            ::back(new_blocks);
  parent_block = std::
                 unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                 ::operator*(this_00);
  pIVar1 = Pass::context((Pass *)this);
  preserved_analyses = operator|(kAnalysisBegin,kAnalysisInstrToBlockMapping);
  InstructionBuilder::InstructionBuilder
            ((InstructionBuilder *)
             &val_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,pIVar1,parent_block,preserved_analyses);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_60);
  local_61 = false;
  local_a8.is_first_operand = &local_61;
  local_a8.val_ids = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_60;
  local_a8.builder =
       (InstructionBuilder *)
       &val_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage;
  local_a8.this = this;
  std::function<void(unsigned_int*)>::
  function<spvtools::opt::InstDebugPrintfPass::GenOutputCode(spvtools::opt::Instruction*,std::vector<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>,std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>>>*)::__0,void>
            ((function<void(unsigned_int*)> *)&local_88,&local_a8);
  Instruction::ForEachInId(printf_inst,&local_88);
  std::function<void_(unsigned_int_*)>::~function(&local_88);
  shader_id = InstructionBuilder::GetUintConstantId
                        ((InstructionBuilder *)
                         &val_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,
                         (this->super_InstrumentPass).shader_id_);
  local_ac = Instruction::unique_id(printf_inst);
  pmVar2 = std::
           unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
           ::operator[](&(this->super_InstrumentPass).uid2offset_,&local_ac);
  instruction_idx_id =
       InstructionBuilder::GetUintConstantId
                 ((InstructionBuilder *)
                  &val_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage,*pmVar2);
  GenDebugStreamWrite(this,shader_id,instruction_idx_id,
                      (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_60,
                      (InstructionBuilder *)
                      &val_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
  pIVar1 = Pass::context((Pass *)this);
  IRContext::KillInst(pIVar1,printf_inst);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_60);
  return;
}

Assistant:

void InstDebugPrintfPass::GenOutputCode(
    Instruction* printf_inst,
    std::vector<std::unique_ptr<BasicBlock>>* new_blocks) {
  BasicBlock* back_blk_ptr = &*new_blocks->back();
  InstructionBuilder builder(
      context(), back_blk_ptr,
      IRContext::kAnalysisDefUse | IRContext::kAnalysisInstrToBlockMapping);
  // Gen debug printf record validation-specific values. The format string
  // will have its id written. Vectors will need to be broken down into
  // component values. float16 will need to be converted to float32. Pointer
  // and uint64 will need to be converted to two uint32 values. float32 will
  // need to be bitcast to uint32. int32 will need to be bitcast to uint32.
  std::vector<uint32_t> val_ids;
  bool is_first_operand = false;
  printf_inst->ForEachInId(
      [&is_first_operand, &val_ids, &builder, this](const uint32_t* iid) {
        // skip set operand
        if (!is_first_operand) {
          is_first_operand = true;
          return;
        }
        Instruction* opnd_inst = get_def_use_mgr()->GetDef(*iid);
        if (opnd_inst->opcode() == spv::Op::OpString) {
          uint32_t string_id_id = builder.GetUintConstantId(*iid);
          val_ids.push_back(string_id_id);
        } else {
          GenOutputValues(opnd_inst, &val_ids, &builder);
        }
      });
  GenDebugStreamWrite(
      builder.GetUintConstantId(shader_id_),
      builder.GetUintConstantId(uid2offset_[printf_inst->unique_id()]), val_ids,
      &builder);
  context()->KillInst(printf_inst);
}